

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_basePathEndingInBackSlash_Test::~Importer_basePathEndingInBackSlash_Test
          (Importer_basePathEndingInBackSlash_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, basePathEndingInBackSlash)
{
    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto importedUnits = parser->parseModel(fileContents("importer/units_imported.cellml"));

    EXPECT_TRUE(importedUnits->hasUnresolvedImports());
    importer->resolveImports(importedUnits, resourcePath("importer\\"));
    EXPECT_FALSE(importedUnits->hasUnresolvedImports());
}